

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsStateQueryUtil.cpp
# Opt level: O3

bool deqp::gls::StateQueryUtil::verifyBooleanValidity(ResultCollector *result,GLboolean v)

{
  ostringstream buf;
  long *local_330;
  long local_328;
  long local_320 [2];
  Hex<2UL> local_310;
  undefined1 local_308 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f8 [6];
  ios_base local_298 [264];
  undefined1 local_190 [376];
  
  if (1 < v) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,"Boolean value was not neither GL_TRUE nor GL_FALSE, got ",0x38)
    ;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_308);
    local_310.value = (deUint64)v;
    tcu::Format::Hex<2UL>::toStream(&local_310,(ostream *)local_308);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_308);
    std::ios_base::~ios_base(local_298);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,(char *)local_330,local_328);
    if (local_330 != local_320) {
      operator_delete(local_330,local_320[0] + 1);
    }
    std::__cxx11::stringbuf::str();
    tcu::ResultCollector::fail(result,(string *)local_308);
    if ((undefined1 *)local_308._0_8_ != local_308 + 0x10) {
      operator_delete((void *)local_308._0_8_,local_2f8[0]._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
    std::ios_base::~ios_base((ios_base *)(local_190 + 0x70));
  }
  return v < 2;
}

Assistant:

static bool verifyBooleanValidity (tcu::ResultCollector& result, glw::GLboolean v)
{
	if (v == GL_TRUE || v == GL_FALSE)
		return true;
	else
	{
		std::ostringstream buf;
		buf << "Boolean value was not neither GL_TRUE nor GL_FALSE, got " << de::toString(tcu::Format::Hex<2>(v));
		result.fail(buf.str());
		return false;
	}
}